

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

size_t create_dnscache_id(char *name,size_t nlen,int port,char *ptr,size_t buflen)

{
  int iVar1;
  size_t n;
  
  if (nlen == 0) {
    nlen = strlen(name);
  }
  n = 0xff;
  if (nlen < 0xff) {
    n = nlen;
  }
  Curl_strntolower(ptr,name,n);
  iVar1 = curl_msnprintf(ptr + n,7,":%u",(ulong)(uint)port);
  return (long)iVar1 + n;
}

Assistant:

static size_t
create_dnscache_id(const char *name,
                   size_t nlen, /* 0 or actual name length */
                   int port, char *ptr, size_t buflen)
{
  size_t len = nlen ? nlen : strlen(name);
  DEBUGASSERT(buflen >= MAX_HOSTCACHE_LEN);
  if(len > (buflen - 7))
    len = buflen - 7;
  /* store and lower case the name */
  Curl_strntolower(ptr, name, len);
  return msnprintf(&ptr[len], 7, ":%u", port) + len;
}